

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void __thiscall
kratos::MergeWireAssignmentsVisitor::visit(MergeWireAssignmentsVisitor *this,Generator *generator)

{
  size_t *this_00;
  bool bVar1;
  reference stmt_00;
  shared_ptr<kratos::Stmt> *stmt;
  iterator __end2;
  iterator __begin2;
  set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  *__range2;
  undefined1 local_78 [8];
  set<std::shared_ptr<kratos::AssignStmt>,_std::less<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  sliced_stmts;
  set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  stmts_to_remove;
  Generator *generator_local;
  MergeWireAssignmentsVisitor *this_local;
  
  std::
  set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ::set((set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
         *)&sliced_stmts._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<std::shared_ptr<kratos::AssignStmt>,_std::less<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  ::set((set<std::shared_ptr<kratos::AssignStmt>,_std::less<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
         *)local_78);
  extract_sliced_stmts
            (generator,
             (set<std::shared_ptr<kratos::AssignStmt>,_std::less<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
              *)local_78);
  get_stmts_to_remove<kratos::Generator>
            (this,generator,
             (set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
              *)&sliced_stmts._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (set<std::shared_ptr<kratos::AssignStmt>,_std::less<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
              *)local_78);
  this_00 = &sliced_stmts._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __end2 = std::
           set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ::begin((set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                    *)this_00);
  stmt = (shared_ptr<kratos::Stmt> *)
         std::
         set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
         ::end((set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                *)this_00);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&stmt);
    if (!bVar1) break;
    stmt_00 = std::_Rb_tree_const_iterator<std::shared_ptr<kratos::Stmt>_>::operator*(&__end2);
    Generator::remove_stmt(generator,stmt_00);
    std::_Rb_tree_const_iterator<std::shared_ptr<kratos::Stmt>_>::operator++(&__end2);
  }
  std::
  set<std::shared_ptr<kratos::AssignStmt>,_std::less<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  ::~set((set<std::shared_ptr<kratos::AssignStmt>,_std::less<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
          *)local_78);
  std::
  set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ::~set((set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
          *)&sliced_stmts._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void visit(Generator* generator) override {
        std::set<std::shared_ptr<Stmt>> stmts_to_remove;

        // first filter out sliced assignments
        std::set<std::shared_ptr<AssignStmt>> sliced_stmts;
        extract_sliced_stmts(generator, sliced_stmts);
        get_stmts_to_remove(generator, stmts_to_remove, sliced_stmts);

        // remove them
        for (auto const& stmt : stmts_to_remove) {
            generator->remove_stmt(stmt);
        }
    }